

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funpack.c
# Opt level: O0

int fu_get_param(int argc,char **argv,fpstate *fpptr)

{
  size_t sVar1;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  char tile [513];
  int iarg;
  int local_1c;
  
  if (*(int *)(in_RDX + 0x69c) != 0x2a) {
    fp_msg((char *)0x10e31b);
    exit(-1);
  }
  *(undefined4 *)(in_RDX + 0x490) = 1;
  local_1c = 1;
  while (((local_1c < in_EDI && (**(char **)(in_RSI + (long)local_1c * 8) == '-')) &&
         (sVar1 = strlen(*(char **)(in_RSI + (long)local_1c * 8)), sVar1 == 2))) {
    if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'F') {
      *(int *)(in_RDX + 0x68) = *(int *)(in_RDX + 0x68) + 1;
      *(undefined4 *)(in_RDX + 0x490) = 0;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'D') {
      *(int *)(in_RDX + 0x6c) = *(int *)(in_RDX + 0x6c) + 1;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'P') {
      local_1c = local_1c + 1;
      if (in_EDI <= local_1c) {
        fu_usage();
        fu_hint();
        exit(-1);
      }
      strncpy((char *)(in_RDX + 0x8c),*(char **)(in_RSI + (long)local_1c * 8),0x200);
      *(undefined1 *)(in_RDX + 0x28c) = 0;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'E') {
      local_1c = local_1c + 1;
      if (in_EDI <= local_1c) {
        fu_usage();
        fu_hint();
        exit(-1);
      }
      strncpy((char *)(in_RDX + 0x28d),*(char **)(in_RSI + (long)local_1c * 8),0x200);
      *(undefined1 *)(in_RDX + 0x48d) = 0;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'S') {
      *(int *)(in_RDX + 0x60) = *(int *)(in_RDX + 0x60) + 1;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'L') {
      *(int *)(in_RDX + 100) = *(int *)(in_RDX + 100) + 1;
    }
    else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'C') {
      *(undefined4 *)(in_RDX + 0x74) = 0;
    }
    else {
      if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'H') {
        fu_help();
        exit(0);
      }
      if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'V') {
        fp_version();
        exit(0);
      }
      if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'Z') {
        *(int *)(in_RDX + 0x78) = *(int *)(in_RDX + 0x78) + 1;
      }
      else if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == 'v') {
        *(undefined4 *)(in_RDX + 0x88) = 1;
      }
      else {
        if (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) != 'O') {
          fp_msg((char *)0x10e712);
          fp_msg((char *)0x10e72b);
          fp_msg((char *)0x10e737);
          fu_usage();
          fu_hint();
          exit(-1);
        }
        local_1c = local_1c + 1;
        if (in_EDI <= local_1c) {
          fu_usage();
          fu_hint();
          exit(-1);
        }
        strncpy((char *)(in_RDX + 0x494),*(char **)(in_RSI + (long)local_1c * 8),0x200);
        *(undefined1 *)(in_RDX + 0x694) = 0;
      }
    }
    local_1c = local_1c + 1;
  }
  if ((*(char *)(in_RDX + 0x28d) != '\0') &&
     ((*(int *)(in_RDX + 0x68) != 0 || (*(int *)(in_RDX + 0x6c) != 0)))) {
    fp_msg((char *)0x10e7b9);
    fu_usage();
    exit(-1);
  }
  if ((*(int *)(in_RDX + 0x60) != 0) &&
     ((*(char *)(in_RDX + 0x494) != '\0' || (*(char *)(in_RDX + 0x8c) != '\0')))) {
    fp_msg((char *)0x10e80a);
    fu_usage();
    exit(-1);
  }
  if ((*(char *)(in_RDX + 0x494) != '\0') && (*(char *)(in_RDX + 0x8c) != '\0')) {
    fp_msg((char *)0x10e84d);
    fu_usage();
    exit(-1);
  }
  if (local_1c < in_EDI) {
    *(int *)(in_RDX + 0x698) = local_1c;
    return 0;
  }
  fp_msg((char *)0x10e878);
  fu_usage();
  exit(-1);
}

Assistant:

int fu_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	iarg;
	char	tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

        /* by default, .fz suffix characters to be deleted from compressed file */
	fpptr->delete_suffix = 1;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if (argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) {

		if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;
                    fpptr->delete_suffix = 0;  /* no suffix in this case */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'P') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->prefix, argv[iarg], SZ_STR-1);
                        fpptr->prefix[SZ_STR-1] = 0;
                    }

		} else if (argv[iarg][1] == 'E') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->extname, argv[iarg], SZ_STR-1);
                        fpptr->extname[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'H') {
		    fu_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);

		} else if (argv[iarg][1] == 'Z') {
		    fpptr->do_gzip_file++;

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'O') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                    }

		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fu_usage (); fu_hint (); exit (-1);
		}

	    } else
		break;
	}
	
	if (fpptr->extname[0] && (fpptr->clobber || fpptr->delete_input)) {
	    fp_msg ("Error: -E option may not be used with -F or -D\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->to_stdout && (fpptr->outfile[0] || fpptr->prefix[0]) ) {

	    fp_msg ("Error: -S option may not be used with -P or -O\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->outfile[0] && fpptr->prefix[0] ) {
	    fp_msg ("Error: -P and -O options may not be used together\n");
	    fu_usage (); exit (-1);
        }

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to uncompress\n");
	    fu_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}